

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall GEO::Logger::notify_status(Logger *this,string *message)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  LoggerClient *pLVar3;
  _Base_ptr p_Var4;
  SmartPointer<GEO::LoggerClient> it;
  SmartPointer<GEO::LoggerClient> local_30;
  
  p_Var4 = (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->clients_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var2) {
    do {
      local_30.pointer_ = *(LoggerClient **)(p_Var4 + 1);
      if (local_30.pointer_ != (LoggerClient *)0x0) {
        piVar1 = &((local_30.pointer_)->super_Counted).nb_refs_;
        *piVar1 = *piVar1 + 1;
      }
      pLVar3 = SmartPointer<GEO::LoggerClient>::operator->(&local_30);
      (*(pLVar3->super_Counted)._vptr_Counted[6])(pLVar3,message);
      if (local_30.pointer_ != (LoggerClient *)0x0) {
        piVar1 = &((local_30.pointer_)->super_Counted).nb_refs_;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*((local_30.pointer_)->super_Counted)._vptr_Counted[1])();
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var2);
  }
  this->current_feature_changed_ = false;
  return;
}

Assistant:

void Logger::notify_status(const std::string& message) {
        for(auto it : clients_) {
            it->status(message);
        }

        current_feature_changed_ = false;
    }